

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QWidget_*>::begin(QList<QWidget_*> *this)

{
  QWidget **n;
  QArrayDataPointer<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QWidget_*> *)0x2d8c49);
  QArrayDataPointer<QWidget_*>::operator->(in_RDI);
  n = QArrayDataPointer<QWidget_*>::begin((QArrayDataPointer<QWidget_*> *)0x2d8c5a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }